

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O3

DropIndicatorPosition __thiscall
QAbstractItemViewPrivate::position
          (QAbstractItemViewPrivate *this,QPoint *pos,QRect *rect,QModelIndex *index)

{
  int iVar1;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  char cVar7;
  uint uVar8;
  DropIndicatorPosition DVar9;
  long lVar10;
  int iVar11;
  int iVar12;
  QRect *pQVar13;
  long in_FS_OFFSET;
  double dVar14;
  QRect local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->overwrite == false) {
    iVar1 = (rect->y1).m_i;
    iVar2 = (rect->y2).m_i;
    dVar14 = (double)((iVar2 - iVar1) + 1) / 5.5;
    iVar12 = (int)((double)((ulong)dVar14 & 0x8000000000000000 | (ulong)DAT_006605c0) + dVar14);
    iVar11 = 0xc;
    if (iVar12 < 0xc) {
      iVar11 = iVar12;
    }
    if (iVar11 < 3) {
      iVar11 = 2;
    }
    iVar12 = (pos->yp).m_i;
    DVar9 = AboveItem;
    if ((iVar12 - iVar1 < iVar11) || (DVar9 = BelowItem, pQVar13 = rect, iVar2 - iVar12 < iVar11))
    goto LAB_00534f75;
  }
  else {
    uVar3 = rect->x1;
    uVar4 = rect->y1;
    uVar5 = rect->x2;
    uVar6 = rect->y2;
    local_38.y1.m_i = uVar4 + -1;
    local_38.x1.m_i = uVar3 + -1;
    local_38.y2.m_i = uVar6 + 1;
    local_38.x2.m_i = uVar5 + 1;
    pQVar13 = &local_38;
  }
  cVar7 = QRect::contains((QPoint *)pQVar13,SUB81(pos,0));
  DVar9 = OnViewport;
  if (cVar7 != '\0') {
    uVar8 = (**(code **)(*(long *)this->model + 0x138))(this->model,index);
    DVar9 = OnItem;
    if ((uVar8 & 8) == 0) {
      lVar10 = (long)(rect->y2).m_i + (long)(rect->y1).m_i;
      DVar9 = ((int)((ulong)(lVar10 - (lVar10 >> 0x3f)) >> 1) <= (pos->yp).m_i) + AboveItem;
    }
  }
LAB_00534f75:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return DVar9;
}

Assistant:

QAbstractItemView::DropIndicatorPosition
QAbstractItemViewPrivate::position(const QPoint &pos, const QRect &rect, const QModelIndex &index) const
{
    QAbstractItemView::DropIndicatorPosition r = QAbstractItemView::OnViewport;
    if (!overwrite) {
        const int margin = qBound(2, qRound(qreal(rect.height()) / 5.5), 12);
        if (pos.y() - rect.top() < margin) {
            r = QAbstractItemView::AboveItem;
        } else if (rect.bottom() - pos.y() < margin) {
            r = QAbstractItemView::BelowItem;
        } else if (rect.contains(pos, true)) {
            r = QAbstractItemView::OnItem;
        }
    } else {
        QRect touchingRect = rect;
        touchingRect.adjust(-1, -1, 1, 1);
        if (touchingRect.contains(pos, false)) {
            r = QAbstractItemView::OnItem;
        }
    }

    if (r == QAbstractItemView::OnItem && (!(model->flags(index) & Qt::ItemIsDropEnabled)))
        r = pos.y() < rect.center().y() ? QAbstractItemView::AboveItem : QAbstractItemView::BelowItem;

    return r;
}